

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

void __thiscall QPDF::initializeEncryption(QPDF *this)

{
  long lVar1;
  element_type *peVar2;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint __val;
  uint uVar10;
  encryption_method_e eVar11;
  qpdf_offset_t qVar12;
  longlong lVar13;
  QPDFExc *pQVar14;
  mapped_type *pmVar15;
  _Rb_tree_node_base *p_Var16;
  uchar *puVar17;
  long *plVar18;
  string *psVar19;
  byte bVar20;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var21;
  string *user_password;
  undefined8 uVar22;
  element_type *peVar23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  uint uVar25;
  mapped_type mVar26;
  QPDFObjectHandle StrF;
  undefined1 local_4e8 [16];
  QPDFObjectHandle encryption_dict;
  QPDFObjectHandle StmF;
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  local_4b8 [2];
  EncryptionData data;
  QPDFObjectHandle EFF;
  QPDFObjectHandle CF;
  undefined1 local_348 [24];
  string Perms;
  string UE;
  string OE;
  QPDFObjectHandle id_obj;
  string U;
  string O;
  QPDFObjectHandle local_280;
  shared_ptr<QPDF::EncryptionParameters> local_270;
  QPDFObjectHandle local_260;
  shared_ptr<QPDF::EncryptionParameters> local_250;
  QPDFObjectHandle local_240;
  shared_ptr<QPDF::EncryptionParameters> local_230;
  size_type __dnew_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  string id1;
  QPDFObjectHandle local_1e0;
  QPDFObjectHandle local_1d0;
  QPDFObjectHandle local_1c0;
  QPDFObjectHandle local_1b0;
  QPDFObjectHandle local_1a0;
  QPDFObjectHandle local_190;
  QPDFObjectHandle local_180;
  QPDFObjectHandle local_170;
  QPDFObjectHandle local_160;
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  _Var21._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  lVar1 = *(long *)&((_Var21._M_head_impl)->encp).
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
  if (*(char *)(lVar1 + 1) != '\0') {
    return;
  }
  *(undefined1 *)(lVar1 + 1) = 1;
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/Encrypt","");
  bVar5 = QPDFObjectHandle::hasKey(&(_Var21._M_head_impl)->trailer,(string *)&data);
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  if (!bVar5) {
    return;
  }
  _Var21._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  **(undefined1 **)
    &((_Var21._M_head_impl)->encp).
     super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> = 1;
  id1._M_dataplus._M_p = (pointer)&id1.field_2;
  id1._M_string_length = 0;
  id1.field_2._M_local_buf[0] = '\0';
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/ID","");
  QPDFObjectHandle::getKey(&id_obj,(string *)&(_Var21._M_head_impl)->trailer);
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  bVar5 = QPDFObjectHandle::isArray(&id_obj);
  if ((bVar5) && (iVar9 = QPDFObjectHandle::getArrayNItems(&id_obj), iVar9 == 2)) {
    QPDFObjectHandle::getArrayItem(&local_160,(int)&id_obj);
    bVar6 = QPDFObjectHandle::isString(&local_160);
    bVar5 = true;
  }
  else {
    bVar5 = false;
    bVar6 = false;
  }
  if ((bVar5) &&
     (local_160.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (bVar6 == false) {
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&StmF,"trailer","");
    StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&StrF,"invalid /ID in trailer dictionary","");
    damagedPDF((QPDFExc *)&data,this,(string *)&StmF,(string *)&StrF);
    warn(this,(QPDFExc *)&data);
    QPDFExc::~QPDFExc((QPDFExc *)&data);
    if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)local_4e8) {
      operator_delete(StrF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_4e8._0_8_ + 1));
    }
    if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         *)StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != local_4b8) {
      operator_delete(StmF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_4b8[0]._0_8_ + 1));
    }
  }
  else {
    QPDFObjectHandle::getArrayItem(&StmF,(int)&id_obj);
    QPDFObjectHandle::getStringValue_abi_cxx11_((string *)&data,&StmF);
    std::__cxx11::string::operator=((string *)&id1,(string *)&data);
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (StmF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  _Var21._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/Encrypt","");
  QPDFObjectHandle::getKey(&encryption_dict,(string *)&(_Var21._M_head_impl)->trailer);
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  bVar5 = QPDFObjectHandle::isDictionary(&encryption_dict);
  if (!bVar5) {
    pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&data,"/Encrypt in trailer dictionary is not a dictionary","");
    damagedPDF(pQVar14,this,(string *)&data);
    __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/Filter","");
  QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
  bVar6 = QPDFObjectHandle::isName(&StmF);
  bVar5 = true;
  if (bVar6) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/Filter","");
    QPDFObjectHandle::getKey(&local_170,(string *)&encryption_dict);
    QPDFObjectHandle::getName_abi_cxx11_(&local_50,&local_170);
    iVar9 = std::__cxx11::string::compare((char *)&local_50);
    bVar5 = iVar9 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_170.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  if (bVar5) {
    pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
    psVar19 = (string *)
              (**(code **)(**(long **)&(((this->m)._M_t.
                                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl
                                        )->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x18))();
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"encryption dictionary","");
    qVar12 = InputSource::getLastOffset
                       ((((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&StmF,"unsupported encryption filter","");
    QPDFExc::QPDFExc(pQVar14,qpdf_e_unsupported,psVar19,(string *)&data,qVar12,(string *)&StmF);
    __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/SubFilter","");
  QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
  bVar5 = QPDFObjectHandle::isNull(&StmF);
  if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  if (!bVar5) {
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"encryption dictionary","");
    qVar12 = InputSource::getLastOffset
                       ((((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&StmF,"file uses encryption SubFilters, which qpdf does not support","");
    warn(this,qpdf_e_unsupported,(string *)&data,qVar12,(string *)&StmF);
    if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         *)StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != local_4b8) {
      operator_delete(StmF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_4b8[0]._0_8_ + 1));
    }
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
  }
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/V","");
  QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
  bVar5 = QPDFObjectHandle::isInteger(&StmF);
  if (bVar5) {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/R","");
    QPDFObjectHandle::getKey(&local_180,(string *)&encryption_dict);
    bVar6 = QPDFObjectHandle::isInteger(&local_180);
    if (!bVar6) goto LAB_00207273;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/O","");
    QPDFObjectHandle::getKey(&local_190,(string *)&encryption_dict);
    bVar6 = QPDFObjectHandle::isString(&local_190);
    if (!bVar6) {
      bVar6 = true;
      goto LAB_00207276;
    }
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"/U","");
    QPDFObjectHandle::getKey(&local_1a0,(string *)&encryption_dict);
    bVar6 = QPDFObjectHandle::isString(&local_1a0);
    if (!bVar6) {
      bVar6 = true;
      bVar8 = true;
      goto LAB_0020727b;
    }
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/P","");
    QPDFObjectHandle::getKey(&local_1b0,(string *)&encryption_dict);
    bVar7 = QPDFObjectHandle::isInteger(&local_1b0);
    bVar6 = true;
    bVar8 = true;
    bVar4 = true;
  }
  else {
LAB_00207273:
    bVar6 = false;
LAB_00207276:
    bVar8 = false;
LAB_0020727b:
    bVar4 = false;
    bVar7 = false;
  }
  if (bVar4) {
    if (local_1b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0] + 1);
    }
  }
  if (bVar8) {
    if (local_1a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
  }
  if (bVar6) {
    if (local_190.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_190.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
  }
  if (bVar5) {
    if (local_180.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_180.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
  }
  if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  if (bVar7 == false) {
    pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"encryption dictionary","");
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&StmF,"some encryption dictionary parameters are missing or the wrong type"
               ,"");
    damagedPDF(pQVar14,this,(string *)&data,(string *)&StmF);
    __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/V","");
  QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
  __val = QPDFObjectHandle::getIntValueAsInt(&StmF);
  if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/R","");
  QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
  iVar9 = QPDFObjectHandle::getIntValueAsInt(&StmF);
  if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/O","");
  QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
  QPDFObjectHandle::getStringValue_abi_cxx11_(&O,&StmF);
  if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/U","");
  QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
  QPDFObjectHandle::getStringValue_abi_cxx11_(&U,&StmF);
  if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  data._0_8_ = &data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/P","");
  QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
  lVar13 = QPDFObjectHandle::getIntValue(&StmF);
  if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string *)data._0_8_ != &data.O) {
    operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
  }
  if (((4 < iVar9 - 2U) || (5 < __val)) || ((0x36U >> (__val & 0x1f) & 1) == 0)) {
    pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
    psVar19 = (string *)
              (**(code **)(**(long **)&(((this->m)._M_t.
                                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl
                                        )->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x18))();
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"encryption dictionary","");
    qVar12 = InputSource::getLastOffset
                       ((((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::to_string(&UE,iVar9);
    std::operator+(&OE,"Unsupported /R or /V in encryption dictionary; R = ",&UE);
    plVar18 = (long *)std::__cxx11::string::append((char *)&OE);
    CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar18;
    peVar23 = (element_type *)(plVar18 + 2);
    if (CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        peVar23) {
      local_348._0_8_ =
           *(undefined8 *)
            &(peVar23->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_348._8_8_ = plVar18[3];
      CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_348;
    }
    else {
      local_348._0_8_ =
           *(undefined8 *)
            &(peVar23->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
    }
    CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar18[1];
    *plVar18 = (long)peVar23;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::to_string(&Perms,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&StrF,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&CF,&Perms);
    plVar18 = (long *)std::__cxx11::string::append((char *)&StrF);
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar18;
    peVar23 = (element_type *)(plVar18 + 2);
    if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == peVar23) {
      local_4b8[0]._0_8_ =
           *(undefined8 *)
            &(peVar23->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_4b8[0]._8_8_ = plVar18[3];
      StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4b8;
    }
    else {
      local_4b8[0]._0_8_ =
           *(undefined8 *)
            &(peVar23->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
    }
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar18[1];
    *plVar18 = (long)peVar23;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    QPDFExc::QPDFExc(pQVar14,qpdf_e_unsupported,psVar19,(string *)&data,qVar12,(string *)&StmF);
    __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  lVar1 = *(long *)&(((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
  *(uint *)(lVar1 + 4) = __val;
  *(int *)(lVar1 + 8) = iVar9;
  OE._M_dataplus._M_p = (pointer)&OE.field_2;
  OE._M_string_length = 0;
  OE.field_2._M_local_buf[0] = '\0';
  UE._M_dataplus._M_p = (pointer)&UE.field_2;
  UE._M_string_length = 0;
  UE.field_2._M_local_buf[0] = '\0';
  Perms._M_dataplus._M_p = (pointer)&Perms.field_2;
  Perms._M_string_length = 0;
  Perms.field_2._M_local_buf[0] = '\0';
  local_348._20_4_ = iVar9;
  if ((int)__val < 5) {
    if (O._M_string_length < 0x20) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&O,O._M_string_length,0,' ' - (char)O._M_string_length);
    }
    if (U._M_string_length < 0x20) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&U,U._M_string_length,0,' ' - (char)U._M_string_length);
    }
    if ((O._M_string_length != 0x20) || (U._M_string_length != 0x20)) {
      pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
      data._0_8_ = &data.O;
      std::__cxx11::string::_M_construct<char_const*>((string *)&data,"encryption dictionary","");
      StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&StmF,"incorrect length for /O and/or /U in encryption dictionary","");
      damagedPDF(pQVar14,this,(string *)&data,(string *)&StmF);
      __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  else {
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/OE","");
    QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
    bVar5 = QPDFObjectHandle::isString(&StmF);
    if (bVar5) {
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/UE","");
      QPDFObjectHandle::getKey(&local_1c0,(string *)&encryption_dict);
      bVar6 = QPDFObjectHandle::isString(&local_1c0);
      if (!bVar6) goto LAB_00207897;
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/Perms","");
      QPDFObjectHandle::getKey(&local_1d0,(string *)&encryption_dict);
      bVar8 = QPDFObjectHandle::isString(&local_1d0);
      bVar6 = true;
    }
    else {
LAB_00207897:
      bVar6 = false;
      bVar8 = false;
    }
    if (bVar6) {
      if (local_1d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_130[0] != local_120) {
        operator_delete(local_130[0],local_120[0] + 1);
      }
    }
    if (bVar5) {
      if (local_1c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1c0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_110[0] != local_100) {
        operator_delete(local_110[0],local_100[0] + 1);
      }
    }
    if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (StmF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    if (bVar8 == false) {
      pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
      data._0_8_ = &data.O;
      std::__cxx11::string::_M_construct<char_const*>((string *)&data,"encryption dictionary","");
      StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&StmF,
                 "some V=5 encryption dictionary parameters are missing or the wrong type","");
      damagedPDF(pQVar14,this,(string *)&data,(string *)&StmF);
      __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&StmF,"/OE","");
    QPDFObjectHandle::getKey(&StrF,(string *)&encryption_dict);
    QPDFObjectHandle::getStringValue_abi_cxx11_((string *)&data,&StrF);
    std::__cxx11::string::operator=((string *)&OE,(string *)&data);
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (StrF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         *)StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != local_4b8) {
      operator_delete(StmF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_4b8[0]._0_8_ + 1));
    }
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&StmF,"/UE","");
    QPDFObjectHandle::getKey(&StrF,(string *)&encryption_dict);
    QPDFObjectHandle::getStringValue_abi_cxx11_((string *)&data,&StrF);
    std::__cxx11::string::operator=((string *)&UE,(string *)&data);
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (StrF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         *)StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != local_4b8) {
      operator_delete(StmF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_4b8[0]._0_8_ + 1));
    }
    StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&StmF,"/Perms","");
    QPDFObjectHandle::getKey(&StrF,(string *)&encryption_dict);
    QPDFObjectHandle::getStringValue_abi_cxx11_((string *)&data,&StrF);
    std::__cxx11::string::operator=((string *)&Perms,(string *)&data);
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (StrF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         *)StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != local_4b8) {
      operator_delete(StmF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_4b8[0]._0_8_ + 1));
    }
    if (O._M_string_length < 0x30) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&O,O._M_string_length,0,'0' - (char)O._M_string_length);
    }
    if (U._M_string_length < 0x30) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&U,U._M_string_length,0,'0' - (char)U._M_string_length);
    }
    if (OE._M_string_length < 0x20) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&OE,OE._M_string_length,0,' ' - (char)OE._M_string_length);
    }
    if (UE._M_string_length < 0x20) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&UE,UE._M_string_length,0,' ' - (char)UE._M_string_length);
    }
    if (Perms._M_string_length < 0x10) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&Perms,Perms._M_string_length,0,'\x10' - (char)Perms._M_string_length);
    }
  }
  uVar25 = 0x28;
  if (1 < (int)__val) {
    if (__val == 4) {
      uVar25 = 0x80;
    }
    else if (__val == 5) {
      uVar25 = 0x100;
    }
    else {
      data._0_8_ = &data.O;
      std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/Length","");
      QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
      bVar5 = QPDFObjectHandle::isInteger(&StmF);
      if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (StmF.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((string *)data._0_8_ != &data.O) {
        operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
      }
      uVar25 = 0;
      if (bVar5) {
        data._0_8_ = &data.O;
        std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/Length","");
        QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
        uVar10 = QPDFObjectHandle::getIntValueAsInt(&StmF);
        if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (StmF.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((string *)data._0_8_ != &data.O) {
          operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
        }
        uVar25 = uVar10;
        if (uVar10 - 0x81 < 0xffffffa7) {
          uVar25 = 0;
        }
        if ((uVar10 & 7) != 0) {
          uVar25 = 0;
        }
      }
    }
  }
  uVar10 = uVar25 + 7;
  if (-1 < (int)uVar25) {
    uVar10 = uVar25;
  }
  *(undefined1 *)
   (*(long *)&(((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> + 0xc) = 1;
  if ((int)__val < 4) {
    bVar5 = false;
  }
  else {
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/EncryptMetadata","");
    QPDFObjectHandle::getKey(&local_1e0,(string *)&encryption_dict);
    bVar5 = QPDFObjectHandle::isBool(&local_1e0);
    if (local_1e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_150[0] != local_140) {
      operator_delete(local_150[0],local_140[0] + 1);
    }
  }
  if (bVar5 != false) {
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/EncryptMetadata","");
    QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
    bVar5 = QPDFObjectHandle::getBoolValue(&StmF);
    *(bool *)(*(long *)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                        super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> +
             0xc) = bVar5;
    if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (StmF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
  }
  if ((__val & 6) == 4) {
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/CF","");
    QPDFObjectHandle::getKey(&CF,(string *)&encryption_dict);
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    local_348._16_4_ = uVar10;
    QPDFObjectHandle::getKeys_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&data,&CF);
    if ((int *)data.O._M_string_length != &data.Length_bytes) {
      p_Var16 = (_Rb_tree_node_base *)data.O._M_string_length;
      do {
        QPDFObjectHandle::getKey(&EFF,(string *)&CF);
        bVar5 = QPDFObjectHandle::isDictionary(&EFF);
        if (bVar5) {
          StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_4b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&StmF,"/CFM","");
          QPDFObjectHandle::getKey(&StrF,(string *)&EFF);
          bVar5 = QPDFObjectHandle::isName(&StrF);
          if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (StrF.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               *)StmF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_4b8) {
            operator_delete(StmF.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)(local_4b8[0]._0_8_ + 1));
          }
          mVar26 = e_none;
          if (bVar5) {
            StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_4e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&StrF,"/CFM","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)&__dnew_1,(string *)&EFF);
            QPDFObjectHandle::getName_abi_cxx11_((string *)&StmF,(QPDFObjectHandle *)&__dnew_1);
            if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
            }
            if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)local_4e8) {
              operator_delete(StrF.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              (ulong)(local_4e8._0_8_ + 1));
            }
            iVar9 = std::__cxx11::string::compare((char *)&StmF);
            if (iVar9 == 0) {
              mVar26 = e_rc4;
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)&StmF);
              if (iVar9 == 0) {
                mVar26 = e_aes;
              }
              else {
                iVar9 = std::__cxx11::string::compare((char *)&StmF);
                mVar26 = (uint)(iVar9 == 0) * 3 + e_unknown;
              }
            }
            if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 *)StmF.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_4b8) {
              operator_delete(StmF.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              (ulong)(local_4b8[0]._0_8_ + 1));
            }
          }
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
                                  *)(*(long *)&(((this->m)._M_t.
                                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                                 .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                                _M_head_impl)->encp).
                                               super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                                    + 0x10),(key_type *)(p_Var16 + 1));
          *pmVar15 = mVar26;
        }
        if (EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (EFF.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != (_Rb_tree_node_base *)&data.Length_bytes);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data);
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/StmF","");
    QPDFObjectHandle::getKey(&StmF,(string *)&encryption_dict);
    uVar10 = local_348._16_4_;
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/StrF","");
    QPDFObjectHandle::getKey(&StrF,(string *)&encryption_dict);
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    data._0_8_ = &data.O;
    std::__cxx11::string::_M_construct<char_const*>((string *)&data,"/EFF","");
    QPDFObjectHandle::getKey(&EFF,(string *)&encryption_dict);
    if ((string *)data._0_8_ != &data.O) {
      operator_delete((void *)data._0_8_,(ulong)(data.O._M_dataplus._M_p + 1));
    }
    _Var21._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    local_230.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ((_Var21._M_head_impl)->encp).
         super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_230.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var21._M_head_impl)->encp + 8)
             )->_M_pi;
    if (local_230.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_230.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_230.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_230.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_230.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_240.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_240.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    eVar11 = interpretCF(&local_230,&local_240);
    *(encryption_method_e *)
     (*(long *)&(((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> + 0x40) =
         eVar11;
    if (local_240.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_240.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_230.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_230.
                 super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    _Var21._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    local_250.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ((_Var21._M_head_impl)->encp).
         super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_250.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var21._M_head_impl)->encp + 8)
             )->_M_pi;
    if (local_250.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_250.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_250.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_250.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_250.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_260.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_260.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    eVar11 = interpretCF(&local_250,&local_260);
    *(encryption_method_e *)
     (*(long *)&(((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> + 0x44) =
         eVar11;
    if (local_260.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_260.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_250.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_250.
                 super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar5 = QPDFObjectHandle::isName(&EFF);
    _Var21._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    peVar2 = ((_Var21._M_head_impl)->encp).
             super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar5) {
      local_270.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var21._M_head_impl)->encp + 8))
           ->_M_pi;
      if (local_270.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_270.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_270.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_270.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_270.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_280.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_270.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      eVar11 = interpretCF(&local_270,&local_280);
      *(encryption_method_e *)
       (*(long *)&(((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                  super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> + 0x48)
           = eVar11;
      if (local_280.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_280.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_270.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_270.
                   super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      peVar2->cf_file = peVar2->cf_stream;
    }
    if (EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (StrF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (StmF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  _Var21._M_head_impl = (Members *)0x10;
  if (uVar25 != 0) {
    _Var21._M_head_impl = (Members *)(ulong)(uint)((int)uVar10 >> 3);
  }
  EncryptionData::EncryptionData
            (&data,__val,local_348._20_4_,(int)_Var21._M_head_impl,(int)lVar13,&O,&U,&OE,&UE,&Perms,
             &id1,*(bool *)(*(long *)&(((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->encp).
                                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                           + 0xc));
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var3._M_head_impl)->provided_password_is_hex_key == false) {
    lVar1 = *(long *)&((_Var3._M_head_impl)->encp).
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
    psVar19 = (string *)(lVar1 + 0x50);
    if (data.V < 5) {
      user_password = (string *)(lVar1 + 0x70);
      compute_O_rc4_key(user_password,psVar19,&data,(uchar *)&EFF);
      puVar17 = QUtil::unsigned_char_pointer(&data.O);
      StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)puVar17;
      StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar17 + 8);
      local_4b8[0]._0_8_ = *(undefined8 *)(puVar17 + 0x10);
      local_4b8[0]._8_8_ = *(undefined8 *)(puVar17 + 0x18);
      CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x10;
      StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4e8;
      StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)std::__cxx11::string::_M_create((ulong *)&StrF,(ulong)&CF);
      local_4e8._0_8_ =
           CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      *(ulong *)&((StrF.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           = CONCAT71(EFF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_,
                      (char)EFF.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)&((StrF.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value).
               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       + 8) = EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      *(undefined1 *)
       ((long)&((CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->value).
               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       + (long)&((StrF.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value).
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       ) = 0;
      p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)data.Length_bytes;
      if ((long)p_Var24 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(data.Length_bytes);
      }
      if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi <= p_Var24 &&
          (long)p_Var24 -
          (long)StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != 0) {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&StrF,
                   (ulong)StrF.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi,0,
                   (char)((long)p_Var24 -
                         (long)StrF.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi));
      }
      puVar17 = QUtil::unsigned_char_pointer((string *)&StrF);
      iVar9 = 0x14;
      if (data.R < 3) {
        iVar9 = 1;
      }
      iterate_rc4((uchar *)&StmF,0x20,puVar17,data.Length_bytes,iVar9,true);
      __dnew_1 = 0x20;
      CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_348;
      CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)std::__cxx11::string::_M_create((ulong *)&CF,(ulong)&__dnew_1);
      local_348._0_8_ = __dnew_1;
      *(undefined8 *)
       ((long)&((CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->value).
               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       + 0x10) = local_4b8[0]._0_8_;
      *(undefined8 *)
       ((long)&((CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->value).
               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       + 0x18) = local_4b8[0]._8_8_;
      *(element_type **)
       &((CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->value).
        super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
        .
        super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
        .
        super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
        .
        super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
        .
        super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
        .
        super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           = StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)&((CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->value).
               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       + 8) = StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__dnew_1;
      *(undefined1 *)
       ((long)&((CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->value).
               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               .
               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       + __dnew_1) = 0;
      _Var21._M_head_impl = (Members *)__dnew_1;
      bVar5 = check_user_password((string *)&CF,&data);
      if (bVar5) {
        std::__cxx11::string::_M_assign((string *)user_password);
      }
      if (CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)local_348) {
        operator_delete(CF.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_348._0_8_ + 1);
      }
      if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_4e8) {
        operator_delete(StrF.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (ulong)(local_4e8._0_8_ + 1));
      }
    }
    else {
      bVar5 = check_owner_password_V5(psVar19,&data);
    }
    lVar1 = *(long *)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
    *(bool *)(lVar1 + 0xd9) = bVar5;
    if (((int)__val < 5) && (bVar5 != false)) {
      getTrimmedUserPassword_abi_cxx11_((string *)&StmF,this);
      lVar1 = *(long *)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                        super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
      if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x58)) {
        if (StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar5 = true;
        }
        else {
          iVar9 = bcmp(StmF.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       *(void **)(lVar1 + 0x50),
                       (size_t)StmF.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
          bVar5 = iVar9 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           *)StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != local_4b8) {
        operator_delete(StmF.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (ulong)(local_4b8[0]._0_8_ + 1));
      }
      if (bVar5) {
        *(undefined1 *)
         (*(long *)&(((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> +
         0xd8) = 1;
      }
    }
    else {
      bVar5 = check_user_password((string *)(lVar1 + 0x50),&data);
      _Var21._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      lVar1 = *(long *)&((string *)&(_Var21._M_head_impl)->encp)->_M_dataplus;
      *(bool *)(lVar1 + 0xd8) = bVar5;
      if (bVar5) {
        std::__cxx11::string::_M_assign((string *)(lVar1 + 0x70));
      }
    }
    lVar1 = *(long *)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                      super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
    bVar20 = *(byte *)(lVar1 + 0xd9) | *(byte *)(lVar1 + 0xd8);
    _Var21._M_head_impl = (Members *)CONCAT71((int7)((ulong)_Var21._M_head_impl >> 8),bVar20);
    if (bVar20 == 0) {
      pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
      psVar19 = (string *)
                (**(code **)(**(long **)&(((this->m)._M_t.
                                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                           .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl)->file).
                                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                            + 0x18))();
      StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&StmF,"");
      StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&StrF,"invalid password","");
      QPDFExc::QPDFExc(pQVar14,qpdf_e_password,psVar19,(string *)&StmF,0,(string *)&StrF);
      __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var3._M_head_impl)->provided_password_is_hex_key == true) {
    QUtil::hex_decode((string *)&StmF,
                      (string *)
                      (*(long *)&((_Var3._M_head_impl)->encp).
                                 super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                      + 0x50));
LAB_002088da:
    std::__cxx11::string::operator=
              ((string *)
               (*(long *)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                          super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
               + 0x90),(string *)&StmF);
    uVar22 = local_4b8[0]._0_8_;
    peVar23 = StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         *)StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr == local_4b8) goto LAB_00208914;
  }
  else {
    if ((int)__val < 5) {
      compute_encryption_key
                ((string *)&StmF,
                 (QPDF *)(*(long *)&((_Var3._M_head_impl)->encp).
                                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                         + 0x70),(string *)&data,(EncryptionData *)_Var21._M_head_impl);
      goto LAB_002088da;
    }
    recover_encryption_key_with_password
              ((string *)&StmF,
               (string *)
               (*(long *)&((_Var3._M_head_impl)->encp).
                          super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
               + 0x50),&data,(bool *)&EFF);
    std::__cxx11::string::operator=
              ((string *)
               (*(long *)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->encp).
                          super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
               + 0x90),(string *)&StmF);
    if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         *)StmF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != local_4b8) {
      operator_delete(StmF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_4b8[0]._0_8_ + 1));
    }
    if ((char)EFF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != '\0') goto LAB_00208914;
    StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&StrF,"encryption dictionary","");
    CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&CF,"/Perms field in encryption dictionary doesn\'t match expected value",
               "");
    damagedPDF((QPDFExc *)&StmF,this,(string *)&StrF,(string *)&CF);
    warn(this,(QPDFExc *)&StmF);
    QPDFExc::~QPDFExc((QPDFExc *)&StmF);
    if (CF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_348) {
      operator_delete(CF.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_348._0_8_ + 1);
    }
    uVar22 = local_4e8._0_8_;
    peVar23 = StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (StrF.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)local_4e8) goto LAB_00208914;
  }
  operator_delete(peVar23,(ulong)((long)&(((element_type *)uVar22)->value).
                                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 + 1));
LAB_00208914:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.id1._M_dataplus._M_p != &data.id1.field_2) {
    operator_delete(data.id1._M_dataplus._M_p,data.id1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.Perms._M_dataplus._M_p != &data.Perms.field_2) {
    operator_delete(data.Perms._M_dataplus._M_p,data.Perms.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.UE._M_dataplus._M_p != &data.UE.field_2) {
    operator_delete(data.UE._M_dataplus._M_p,data.UE.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.OE._M_dataplus._M_p != &data.OE.field_2) {
    operator_delete(data.OE._M_dataplus._M_p,data.OE.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.U._M_dataplus._M_p != &data.U.field_2) {
    operator_delete(data.U._M_dataplus._M_p,data.U.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.O._M_dataplus._M_p != &data.O.field_2) {
    operator_delete(data.O._M_dataplus._M_p,data.O.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)Perms._M_dataplus._M_p != &Perms.field_2) {
    operator_delete(Perms._M_dataplus._M_p,
                    CONCAT71(Perms.field_2._M_allocated_capacity._1_7_,Perms.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)UE._M_dataplus._M_p != &UE.field_2) {
    operator_delete(UE._M_dataplus._M_p,
                    CONCAT71(UE.field_2._M_allocated_capacity._1_7_,UE.field_2._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)OE._M_dataplus._M_p != &OE.field_2) {
    operator_delete(OE._M_dataplus._M_p,
                    CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)U._M_dataplus._M_p != &U.field_2) {
    operator_delete(U._M_dataplus._M_p,U.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)O._M_dataplus._M_p != &O.field_2) {
    operator_delete(O._M_dataplus._M_p,O.field_2._M_allocated_capacity + 1);
  }
  if (encryption_dict.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (encryption_dict.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (id_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (id_obj.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)id1._M_dataplus._M_p != &id1.field_2) {
    operator_delete(id1._M_dataplus._M_p,
                    CONCAT71(id1.field_2._M_allocated_capacity._1_7_,id1.field_2._M_local_buf[0]) +
                    1);
  }
  return;
}

Assistant:

void
QPDF::initializeEncryption()
{
    if (m->encp->encryption_initialized) {
        return;
    }
    m->encp->encryption_initialized = true;

    // After we initialize encryption parameters, we must use stored key information and never look
    // at /Encrypt again.  Otherwise, things could go wrong if someone mutates the encryption
    // dictionary.

    if (!m->trailer.hasKey("/Encrypt")) {
        return;
    }

    // Go ahead and set m->encrypted here.  That way, isEncrypted will return true even if there
    // were errors reading the encryption dictionary.
    m->encp->encrypted = true;

    std::string id1;
    QPDFObjectHandle id_obj = m->trailer.getKey("/ID");
    if ((id_obj.isArray() && (id_obj.getArrayNItems() == 2) && id_obj.getArrayItem(0).isString())) {
        id1 = id_obj.getArrayItem(0).getStringValue();
    } else {
        // Treating a missing ID as the empty string enables qpdf to decrypt some invalid encrypted
        // files with no /ID that poppler can read but Adobe Reader can't.
        warn(damagedPDF("trailer", "invalid /ID in trailer dictionary"));
    }

    QPDFObjectHandle encryption_dict = m->trailer.getKey("/Encrypt");
    if (!encryption_dict.isDictionary()) {
        throw damagedPDF("/Encrypt in trailer dictionary is not a dictionary");
    }

    if (!(encryption_dict.getKey("/Filter").isName() &&
          (encryption_dict.getKey("/Filter").getName() == "/Standard"))) {
        throw QPDFExc(
            qpdf_e_unsupported,
            m->file->getName(),
            "encryption dictionary",
            m->file->getLastOffset(),
            "unsupported encryption filter");
    }
    if (!encryption_dict.getKey("/SubFilter").isNull()) {
        warn(
            qpdf_e_unsupported,
            "encryption dictionary",
            m->file->getLastOffset(),
            "file uses encryption SubFilters, which qpdf does not support");
    }

    if (!(encryption_dict.getKey("/V").isInteger() && encryption_dict.getKey("/R").isInteger() &&
          encryption_dict.getKey("/O").isString() && encryption_dict.getKey("/U").isString() &&
          encryption_dict.getKey("/P").isInteger())) {
        throw damagedPDF(
            "encryption dictionary",
            "some encryption dictionary parameters are missing or the wrong "
            "type");
    }

    int V = encryption_dict.getKey("/V").getIntValueAsInt();
    int R = encryption_dict.getKey("/R").getIntValueAsInt();
    std::string O = encryption_dict.getKey("/O").getStringValue();
    std::string U = encryption_dict.getKey("/U").getStringValue();
    int P = static_cast<int>(encryption_dict.getKey("/P").getIntValue());

    // If supporting new encryption R/V values, remember to update error message inside this if
    // statement.
    if (!(((R >= 2) && (R <= 6)) && ((V == 1) || (V == 2) || (V == 4) || (V == 5)))) {
        throw QPDFExc(
            qpdf_e_unsupported,
            m->file->getName(),
            "encryption dictionary",
            m->file->getLastOffset(),
            "Unsupported /R or /V in encryption dictionary; R = " + std::to_string(R) +
                " (max 6), V = " + std::to_string(V) + " (max 5)");
    }

    m->encp->encryption_V = V;
    m->encp->encryption_R = R;

    // OE, UE, and Perms are only present if V >= 5.
    std::string OE;
    std::string UE;
    std::string Perms;

    if (V < 5) {
        // These must be exactly the right number of bytes.
        pad_short_parameter(O, key_bytes);
        pad_short_parameter(U, key_bytes);
        if (!((O.length() == key_bytes) && (U.length() == key_bytes))) {
            throw damagedPDF(
                "encryption dictionary",
                "incorrect length for /O and/or /U in encryption dictionary");
        }
    } else {
        if (!(encryption_dict.getKey("/OE").isString() &&
              encryption_dict.getKey("/UE").isString() &&
              encryption_dict.getKey("/Perms").isString())) {
            throw damagedPDF(
                "encryption dictionary",
                "some V=5 encryption dictionary parameters are missing or the "
                "wrong type");
        }
        OE = encryption_dict.getKey("/OE").getStringValue();
        UE = encryption_dict.getKey("/UE").getStringValue();
        Perms = encryption_dict.getKey("/Perms").getStringValue();

        // These may be longer than the minimum number of bytes.
        pad_short_parameter(O, OU_key_bytes_V5);
        pad_short_parameter(U, OU_key_bytes_V5);
        pad_short_parameter(OE, OUE_key_bytes_V5);
        pad_short_parameter(UE, OUE_key_bytes_V5);
        pad_short_parameter(Perms, Perms_key_bytes_V5);
    }

    int Length = 0;
    if (V <= 1) {
        Length = 40;
    } else if (V == 4) {
        Length = 128;
    } else if (V == 5) {
        Length = 256;
    } else {
        if (encryption_dict.getKey("/Length").isInteger()) {
            Length = encryption_dict.getKey("/Length").getIntValueAsInt();
            if ((Length % 8) || (Length < 40) || (Length > 128)) {
                Length = 0;
            }
        }
    }
    if (Length == 0) {
        // Still no Length? Just take a guess.
        Length = 128;
    }

    m->encp->encrypt_metadata = true;
    if ((V >= 4) && (encryption_dict.getKey("/EncryptMetadata").isBool())) {
        m->encp->encrypt_metadata = encryption_dict.getKey("/EncryptMetadata").getBoolValue();
    }

    if ((V == 4) || (V == 5)) {
        QPDFObjectHandle CF = encryption_dict.getKey("/CF");
        for (auto const& filter: CF.getKeys()) {
            QPDFObjectHandle cdict = CF.getKey(filter);
            if (cdict.isDictionary()) {
                encryption_method_e method = e_none;
                if (cdict.getKey("/CFM").isName()) {
                    std::string method_name = cdict.getKey("/CFM").getName();
                    if (method_name == "/V2") {
                        QTC::TC("qpdf", "QPDF_encryption CFM V2");
                        method = e_rc4;
                    } else if (method_name == "/AESV2") {
                        QTC::TC("qpdf", "QPDF_encryption CFM AESV2");
                        method = e_aes;
                    } else if (method_name == "/AESV3") {
                        QTC::TC("qpdf", "QPDF_encryption CFM AESV3");
                        method = e_aesv3;
                    } else {
                        // Don't complain now -- maybe we won't need to reference this type.
                        method = e_unknown;
                    }
                }
                m->encp->crypt_filters[filter] = method;
            }
        }

        QPDFObjectHandle StmF = encryption_dict.getKey("/StmF");
        QPDFObjectHandle StrF = encryption_dict.getKey("/StrF");
        QPDFObjectHandle EFF = encryption_dict.getKey("/EFF");
        m->encp->cf_stream = interpretCF(m->encp, StmF);
        m->encp->cf_string = interpretCF(m->encp, StrF);
        if (EFF.isName()) {
            // qpdf does not use this for anything other than informational purposes. This is
            // intended to instruct conforming writers on which crypt filter should be used when new
            // file attachments are added to a PDF file, but qpdf never generates encrypted files
            // with non-default crypt filters. Prior to 10.2, I was under the mistaken impression
            // that this was supposed to be used for decrypting attachments, but the code was wrong
            // in a way that turns out not to have mattered because no writers were generating files
            // the way I was imagining. Still, providing this information could be useful when
            // looking at a file generated by something else, such as Acrobat when specifying that
            // only attachments should be encrypted.
            m->encp->cf_file = interpretCF(m->encp, EFF);
        } else {
            m->encp->cf_file = m->encp->cf_stream;
        }
    }

    EncryptionData data(V, R, Length / 8, P, O, U, OE, UE, Perms, id1, m->encp->encrypt_metadata);
    if (m->provided_password_is_hex_key) {
        // ignore passwords in file
    } else {
        m->encp->owner_password_matched =
            check_owner_password(m->encp->user_password, m->encp->provided_password, data);
        if (m->encp->owner_password_matched && (V < 5)) {
            // password supplied was owner password; user_password has been initialized for V < 5
            if (getTrimmedUserPassword() == m->encp->provided_password) {
                m->encp->user_password_matched = true;
                QTC::TC("qpdf", "QPDF_encryption user matches owner V < 5");
            }
        } else {
            m->encp->user_password_matched = check_user_password(m->encp->provided_password, data);
            if (m->encp->user_password_matched) {
                m->encp->user_password = m->encp->provided_password;
            }
        }
        if (m->encp->user_password_matched && m->encp->owner_password_matched) {
            QTC::TC("qpdf", "QPDF_encryption same password", (V < 5) ? 0 : 1);
        }
        if (!(m->encp->owner_password_matched || m->encp->user_password_matched)) {
            throw QPDFExc(qpdf_e_password, m->file->getName(), "", 0, "invalid password");
        }
    }

    if (m->provided_password_is_hex_key) {
        m->encp->encryption_key = QUtil::hex_decode(m->encp->provided_password);
    } else if (V < 5) {
        // For V < 5, the user password is encrypted with the owner password, and the user password
        // is always used for computing the encryption key.
        m->encp->encryption_key = compute_encryption_key(m->encp->user_password, data);
    } else {
        // For V >= 5, either password can be used independently to compute the encryption key, and
        // neither password can be used to recover the other.
        bool perms_valid;
        m->encp->encryption_key =
            recover_encryption_key_with_password(m->encp->provided_password, data, perms_valid);
        if (!perms_valid) {
            warn(damagedPDF(
                "encryption dictionary",
                "/Perms field in encryption dictionary doesn't match expected "
                "value"));
        }
    }
}